

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O3

void xmlParserPrintFileContextInternal(xmlParserInputPtr input,xmlGenericErrorFunc chanl,void *data)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  long lVar4;
  uint uVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  xmlChar xVar8;
  xmlChar content [81];
  xmlChar local_68 [88];
  
  if (input != (xmlParserInputPtr)0x0) {
    pxVar6 = local_68;
    pxVar7 = input->base;
    pxVar1 = input->cur;
    pxVar3 = pxVar1;
    for (pxVar2 = pxVar1;
        (pxVar7 < pxVar2 && ((*pxVar2 == '\r' || (pxVar3 = pxVar2, *pxVar2 == '\n'))));
        pxVar2 = pxVar2 + -1) {
      pxVar3 = pxVar7;
    }
    if (pxVar7 < pxVar3) {
      uVar5 = 1;
      do {
        xVar8 = *pxVar3;
        if ((xVar8 == '\n') || (xVar8 == '\r')) goto LAB_00102fd8;
        pxVar3 = pxVar3 + -1;
      } while ((uVar5 < 0x50) && (uVar5 = uVar5 + 1, pxVar7 < pxVar3));
    }
    xVar8 = *pxVar3;
LAB_00102fd8:
    if ((xVar8 == '\r') || (xVar8 == '\n')) {
      pxVar3 = pxVar3 + 1;
    }
    for (lVar4 = 0;
        (((xVar8 = pxVar3[lVar4], xVar8 != '\0' && (xVar8 != '\n')) && (xVar8 != '\r')) &&
        ((uint)lVar4 < 0x50)); lVar4 = lVar4 + 1) {
      local_68[lVar4] = xVar8;
    }
    local_68[lVar4] = '\0';
    channel(input,"%s\n",local_68);
    pxVar7 = local_68;
    if ((int)pxVar1 != (int)pxVar3) {
      lVar4 = 0;
      do {
        if ((int)lVar4 == 0x4f) break;
        if (local_68[lVar4] != '\t') {
          pxVar7 = pxVar6;
          if (local_68[lVar4] == '\0') goto LAB_00103057;
          local_68[lVar4] = ' ';
        }
        pxVar6 = pxVar6 + 1;
        lVar4 = lVar4 + 1;
      } while ((int)pxVar1 - (int)pxVar3 != (int)lVar4);
      pxVar7 = local_68 + lVar4;
    }
LAB_00103057:
    pxVar7[0] = '^';
    pxVar7[1] = '\0';
    channel(input,"%s\n",local_68);
  }
  return;
}

Assistant:

static void
xmlParserPrintFileContextInternal(xmlParserInputPtr input ,
		xmlGenericErrorFunc chanl, void *data ) {
    const xmlChar *cur, *base;
    unsigned int n, col;	/* GCC warns if signed, because compared with sizeof() */
    xmlChar  content[81]; /* space for 80 chars + line terminator */
    xmlChar *ctnt;

    if (input == NULL) return;
    cur = input->cur;
    base = input->base;
    /* skip backwards over any end-of-lines */
    while ((cur > base) && ((*(cur) == '\n') || (*(cur) == '\r'))) {
	cur--;
    }
    n = 0;
    /* search backwards for beginning-of-line (to max buff size) */
    while ((n++ < (sizeof(content)-1)) && (cur > base) &&
   (*(cur) != '\n') && (*(cur) != '\r'))
        cur--;
    if ((*(cur) == '\n') || (*(cur) == '\r')) cur++;
    /* calculate the error position in terms of the current position */
    col = input->cur - cur;
    /* search forward for end-of-line (to max buff size) */
    n = 0;
    ctnt = content;
    /* copy selected text to our buffer */
    while ((*cur != 0) && (*(cur) != '\n') &&
   (*(cur) != '\r') && (n < sizeof(content)-1)) {
		*ctnt++ = *cur++;
	n++;
    }
    *ctnt = 0;
    /* print out the selected text */
    chanl(data ,"%s\n", content);
    /* create blank line with problem pointer */
    n = 0;
    ctnt = content;
    /* (leave buffer space for pointer + line terminator) */
    while ((n<col) && (n++ < sizeof(content)-2) && (*ctnt != 0)) {
	if (*(ctnt) != '\t')
	    *(ctnt) = ' ';
	ctnt++;
    }
    *ctnt++ = '^';
    *ctnt = 0;
    chanl(data ,"%s\n", content);
}